

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_compute_num_workers_for_mt(AV1_COMP *cpi)

{
  int tile_rows;
  int iVar1;
  int iVar2;
  int max_workers;
  int i;
  long lVar3;
  
  lVar3 = 0;
  if (AOM_RC_FIRST_PASS < (cpi->oxcf).pass) {
    iVar1 = 0;
    goto LAB_001c51ce;
  }
  max_workers = (cpi->oxcf).max_threads;
  do {
    iVar1 = compute_num_enc_workers(cpi,max_workers);
LAB_001c51ce:
    while( true ) {
      (cpi->ppi->p_mt_info).num_mod_workers[lVar3] = iVar1;
      lVar3 = lVar3 + 1;
      if (lVar3 == 0xc) {
        return;
      }
      max_workers = (cpi->oxcf).max_threads;
      if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) break;
      if (max_workers < 2) {
        iVar1 = 1;
      }
      else {
        iVar2 = (cpi->common).height;
        iVar1 = iVar2 + 0x1f;
        iVar2 = iVar2 + 0x3e;
        if (-1 < iVar1) {
          iVar2 = iVar1;
        }
        iVar1 = iVar2 >> 5;
        if (max_workers < iVar2 >> 5) {
          iVar1 = max_workers;
        }
      }
    }
  } while( true );
}

Assistant:

void av1_compute_num_workers_for_mt(AV1_COMP *cpi) {
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->ppi->p_mt_info.num_mod_workers[i] =
        compute_num_mod_workers(cpi, (MULTI_THREADED_MODULES)i);
  }
}